

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_interface_linux.c
# Opt level: O0

void os_interface_linux_address_interrupt(os_interface_ip_change *addr)

{
  list_entity *plVar1;
  list_entity *plVar2;
  bool bVar3;
  os_interface_ip_change *addr_local;
  
  bVar3 = false;
  if ((addr->_internal)._node.next != (list_entity *)0x0) {
    bVar3 = (addr->_internal)._node.prev != (list_entity *)0x0;
  }
  if (bVar3) {
    plVar1 = (addr->_internal)._node.prev;
    plVar2 = (addr->_internal)._node.next;
    plVar1->next = plVar2;
    plVar2->prev = plVar1;
    (addr->_internal)._node.prev = (list_entity *)0x0;
    (addr->_internal)._node.next = (list_entity *)0x0;
    if (addr->cb_finished != (_func_void_os_interface_ip_change_ptr_int *)0x0) {
      (*addr->cb_finished)(addr,-1);
    }
  }
  return;
}

Assistant:

void
os_interface_linux_address_interrupt(struct os_interface_ip_change *addr) {
  if (list_is_node_added(&addr->_internal._node)) {
    /* remove first to prevent any kind of recursive cleanup */
    list_remove(&addr->_internal._node);

    if (addr->cb_finished) {
      addr->cb_finished(addr, -1);
    }
  }
}